

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::Sudoku(Sudoku *this,string *soubor)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  istream *piVar5;
  ostream *poVar6;
  long local_228;
  ifstream souborKeCteni;
  int local_20;
  char local_19;
  int index;
  char znak;
  string *soubor_local;
  Sudoku *this_local;
  
  local_20 = 0;
  _index = soubor;
  soubor_local = (string *)this;
  initPole(this);
  std::ifstream::ifstream(&local_228);
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::open(&local_228,uVar4,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    while( true ) {
      piVar5 = std::operator>>((istream *)&local_228,&local_19);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2 || 0x50 < local_20) break;
      if ((local_19 < '1') || ('9' < local_19)) {
        if ((local_19 == '.') || (local_19 == ',')) {
          local_20 = local_20 + 1;
        }
      }
      else {
        iVar3 = doplnK(this,local_20 % 9,local_20 / 9,local_19 + -0x30);
        if (iVar3 == 0) {
          std::ifstream::close();
          (this->s).stav = 1;
          poVar6 = std::operator<<((ostream *)&std::cerr,"Soubor neodpovida pravidlum sudoku.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          goto LAB_00107781;
        }
        *(byte *)((this->s).pole + local_20) = *(byte *)((this->s).pole + local_20) & 0xef | 0x10;
        local_20 = local_20 + 1;
      }
    }
    if (local_20 == 0x51) {
      (this->s).stav = 2;
    }
    else {
      std::ifstream::close();
      (this->s).stav = 1;
      poVar6 = std::operator<<((ostream *)&std::cerr,"Soubor neobsahuje cele sudoku.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Soubor ");
    poVar6 = std::operator<<(poVar6,(string *)soubor);
    poVar6 = std::operator<<(poVar6," nelze precist.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    (this->s).stav = 1;
  }
LAB_00107781:
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

Sudoku::Sudoku(string soubor)
{
  char znak;
  int index = 0;
  initPole();// vynulujeme pole
  // otevreme soubor pro cteni
  ifstream souborKeCteni;
  souborKeCteni.open(soubor.c_str());

  if (!souborKeCteni) // nepodarilo se?
  {
    cerr << "Soubor " << soubor << " nelze precist." << endl;
    s.stav= _chyba; // nastavime chybovy stav a vratime se
    return;
  }
  while ((souborKeCteni >> znak) && (index < 81)) // cteni ze souboru po znacich dokud nemame cele sudoku prectene
  {
    if(znak >= '1' && znak <= '9')// je to cislo?
    {
      if (doplnK(index %9, index/9, znak - '1' + 1)) // zkusime ho doplnit do sudoku
      {
        s.pole[index].pevne = 1; // vsechna policka nactena za souboru jsou pevna
        index++;
        continue;// kdyz se povede, pokracujeme dalsim znakem
      }
      // pokud se nepodari doplnit, propadne to sem, dojde k chybe
      souborKeCteni.close();
      s.stav= _chyba;
      cerr << "Soubor neodpovida pravidlum sudoku." << endl;
      return;
    }
    else if(znak == '.' || znak == ',')// je to tecka nebo carka?
    {
      index++;// prazdne policko -> posuneme se o policko dal
    }
    // jinak se nic nedeje.
  }
  if(index != 81)// pokud jsme nedosli na konec sudoku, znamena to, ze ho kus chybi
  {
    // uklidime a nastavime chybovy stav
    souborKeCteni.close();
    s.stav= _chyba;
    cerr << "Soubor neobsahuje cele sudoku." << endl;
    return;
  }
  s.stav = _nastavene; // vse OK
}